

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int64_t mtree_atol(char **p)

{
  char **p_local;
  
  if (**p == '0') {
    if (((*p)[1] == 'x') || ((*p)[1] == 'X')) {
      *p = *p + 2;
      p_local = (char **)mtree_atol16(p);
    }
    else {
      p_local = (char **)mtree_atol8(p);
    }
  }
  else {
    p_local = (char **)mtree_atol10(p);
  }
  return (int64_t)p_local;
}

Assistant:

static int64_t
mtree_atol(char **p)
{
	if (**p != '0')
		return mtree_atol10(p);
	if ((*p)[1] == 'x' || (*p)[1] == 'X') {
		*p += 2;
		return mtree_atol16(p);
	}
	return mtree_atol8(p);
}